

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overload_1.cxx
# Opt level: O3

int __thiscall Int::operator_cast_to_int(Int *this)

{
  ostream *this_00;
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_94f,0x1c);
  this_00 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
  plVar1 = (long *)std::ostream::operator<<(this_00,this->value);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return this->value;
}

Assistant:

operator int() {
        std::cout << "int型で返却しました[" << this << "]" << ":" << value << std::endl;
        return value;
    }